

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O0

size_t __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::appendFormat
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,C *formatString,...)

{
  char in_AL;
  undefined4 *puVar1;
  size_t sVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  axl_va_list *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  axl_va_list *in_XMM6_Qa;
  C *in_XMM6_Qb;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_XMM7_Qa;
  axl_va_list va;
  axl_va_list *in_stack_fffffffffffffec8;
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  axl_va_list *in_stack_ffffffffffffff78;
  C *in_stack_ffffffffffffff80;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffff88;
  axl_va_list local_30;
  undefined8 local_10;
  axl_va_list *local_8;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    in_stack_ffffffffffffff78 = in_XMM6_Qa;
    in_stack_ffffffffffffff80 = in_XMM6_Qb;
    in_stack_ffffffffffffff88 = in_XMM7_Qa;
  }
  local_108 = in_RDX;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  local_10 = in_RSI;
  local_8 = in_RDI;
  axl_va_list::axl_va_list(&local_30);
  puVar1 = (undefined4 *)axl_va_list::initialize(&local_30);
  *(undefined1 **)(puVar1 + 4) = local_118;
  *(undefined1 **)(puVar1 + 2) = &stack0x00000008;
  puVar1[1] = 0x30;
  *puVar1 = 0x10;
  axl_va_list::axl_va_list(in_RDI,in_stack_fffffffffffffec8);
  sVar2 = appendFormat_va(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                          in_stack_ffffffffffffff78);
  axl_va_list::~axl_va_list((axl_va_list *)0x12f66c);
  axl_va_list::~axl_va_list((axl_va_list *)0x12f679);
  return sVar2;
}

Assistant:

size_t
	appendFormat(
		const C* formatString,
		...
	) {
		AXL_VA_DECL(va, formatString);
		return appendFormat_va(formatString, va);
	}